

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcolr.c
# Opt level: O0

FT_Bool tt_face_get_colr_glyph_paint
                  (TT_Face face,FT_UInt base_glyph,FT_Color_Root_Transform root_transform,
                  FT_OpaquePaint *opaque_paint)

{
  FT_Bool FVar1;
  FT_Byte *pFVar2;
  FT_Byte *p;
  BaseGlyphV1Record base_glyph_v1_record;
  Colr *colr;
  FT_OpaquePaint *opaque_paint_local;
  FT_Color_Root_Transform root_transform_local;
  FT_UInt base_glyph_local;
  TT_Face face_local;
  
  base_glyph_v1_record.paint_offset = (FT_ULong)face->colr;
  if (((short *)base_glyph_v1_record.paint_offset == (short *)0x0) ||
     (*(long *)(base_glyph_v1_record.paint_offset + 0x80) == 0)) {
    face_local._7_1_ = '\0';
  }
  else if ((*(short *)base_glyph_v1_record.paint_offset == 0) ||
          ((*(long *)(base_glyph_v1_record.paint_offset + 0x18) == 0 ||
           (*(long *)(base_glyph_v1_record.paint_offset + 0x20) == 0)))) {
    face_local._7_1_ = '\0';
  }
  else if (opaque_paint->p == (FT_Byte *)0x0) {
    FVar1 = find_base_glyph_v1_record
                      (*(FT_Byte **)(base_glyph_v1_record.paint_offset + 0x20),
                       (FT_UInt)*(undefined8 *)(base_glyph_v1_record.paint_offset + 0x18),base_glyph
                       ,(BaseGlyphV1Record *)&p);
    if (FVar1 == '\0') {
      face_local._7_1_ = '\0';
    }
    else if ((base_glyph_v1_record._0_8_ == 0) ||
            (*(ulong *)(base_glyph_v1_record.paint_offset + 0x88) <
             (ulong)base_glyph_v1_record._0_8_)) {
      face_local._7_1_ = '\0';
    }
    else {
      pFVar2 = (FT_Byte *)
               (*(long *)(base_glyph_v1_record.paint_offset + 0x20) + base_glyph_v1_record._0_8_);
      if (pFVar2 < (FT_Byte *)
                   (*(long *)(base_glyph_v1_record.paint_offset + 0x80) +
                   *(long *)(base_glyph_v1_record.paint_offset + 0x88))) {
        opaque_paint->p = pFVar2;
        if (root_transform == FT_COLOR_INCLUDE_ROOT_TRANSFORM) {
          opaque_paint->insert_root_transform = '\x01';
        }
        else {
          opaque_paint->insert_root_transform = '\0';
        }
        face_local._7_1_ = '\x01';
      }
      else {
        face_local._7_1_ = '\0';
      }
    }
  }
  else {
    face_local._7_1_ = '\0';
  }
  return face_local._7_1_;
}

Assistant:

FT_LOCAL_DEF( FT_Bool )
  tt_face_get_colr_glyph_paint( TT_Face                  face,
                                FT_UInt                  base_glyph,
                                FT_Color_Root_Transform  root_transform,
                                FT_OpaquePaint*          opaque_paint )
  {
    Colr*              colr = (Colr*)face->colr;
    BaseGlyphV1Record  base_glyph_v1_record;
    FT_Byte*           p;

    if ( !colr || !colr->table )
      return 0;

    if ( colr->version < 1 || !colr->num_base_glyphs_v1 ||
         !colr->base_glyphs_v1 )
      return 0;

    if ( opaque_paint->p )
      return 0;

    if ( !find_base_glyph_v1_record( colr->base_glyphs_v1,
                                     colr->num_base_glyphs_v1,
                                     base_glyph,
                                     &base_glyph_v1_record ) )
      return 0;

    if ( !base_glyph_v1_record.paint_offset                   ||
         base_glyph_v1_record.paint_offset > colr->table_size )
      return 0;

    p = (FT_Byte*)( colr->base_glyphs_v1 +
                    base_glyph_v1_record.paint_offset );
    if ( p >= ( (FT_Byte*)colr->table + colr->table_size ) )
      return 0;

    opaque_paint->p = p;

    if ( root_transform == FT_COLOR_INCLUDE_ROOT_TRANSFORM )
      opaque_paint->insert_root_transform = 1;
    else
      opaque_paint->insert_root_transform = 0;

    return 1;
  }